

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O0

PropertyQueryFlags __thiscall
Js::CrossSiteObject<Js::SpreadArgument>::GetPropertyQuery
          (CrossSiteObject<Js::SpreadArgument> *this,Var originalInstance,PropertyId propertyId,
          Var *value,PropertyValueInfo *info,ScriptContext *requestContext)

{
  PropertyQueryFlags val;
  BOOL BVar1;
  ScriptContext *scriptContext;
  Var pvVar2;
  PropertyQueryFlags result;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *value_local;
  PropertyId propertyId_local;
  Var originalInstance_local;
  CrossSiteObject<Js::SpreadArgument> *this_local;
  
  scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pvVar2 = CrossSite::MarshalVar(scriptContext,originalInstance,false);
  val = SpreadArgument::GetPropertyQuery
                  (&this->super_SpreadArgument,pvVar2,propertyId,value,info,requestContext);
  BVar1 = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
  if (BVar1 != 0) {
    pvVar2 = CrossSite::MarshalVar(requestContext,*value,false);
    *value = pvVar2;
  }
  return val;
}

Assistant:

PropertyQueryFlags CrossSiteObject<T>::GetPropertyQuery(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        originalInstance = CrossSite::MarshalVar(this->GetScriptContext(), originalInstance);
        PropertyQueryFlags result = __super::GetPropertyQuery(originalInstance, propertyId, value, info, requestContext);
        if (JavascriptConversion::PropertyQueryFlagsToBoolean(result))
        {
            *value = CrossSite::MarshalVar(requestContext, *value);
        }
        return result;
    }